

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertions.h
# Opt level: O0

void __thiscall
UnitTests::Assert::
RangeEquals<std::_List_iterator<long>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
          (Assert *this,string *msg,_List_iterator<long> expected_first,
          _List_iterator<long> expected_last,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> got_first,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> got_last)

{
  difference_type dVar1;
  bool bVar2;
  allocator local_121;
  string local_120 [32];
  int *local_100;
  int *local_f8;
  _List_node_base *local_f0;
  pair<std::_List_iterator<long>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
  local_e8;
  _Self local_d8;
  _List_iterator<long> dif;
  allocator local_91;
  string local_90 [32];
  Assert *local_70;
  int *local_68;
  difference_type local_60;
  difference_type got_len;
  _List_node_base *local_50;
  long local_48;
  difference_type expected_len;
  string *msg_local;
  Assert *this_local;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> got_last_local;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> got_first_local;
  _List_iterator<long> expected_last_local;
  _List_iterator<long> expected_first_local;
  
  got_len = (difference_type)expected_last._M_node;
  local_50 = expected_first._M_node;
  expected_len = (difference_type)msg;
  msg_local = (string *)this;
  this_local = (Assert *)got_last._M_current;
  got_last_local = got_first;
  got_first_local._M_current = (int *)expected_last._M_node;
  local_48 = std::distance<std::_List_iterator<long>>(expected_first,expected_last);
  local_68 = got_last_local._M_current;
  local_70 = this_local;
  local_60 = std::distance<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                       (got_last_local,
                        (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                        this_local);
  dVar1 = expected_len;
  if (local_48 != local_60) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_90," length",&local_91);
    dif._M_node = (_List_node_base *)got_first_local._M_current;
    RangeError<std::_List_iterator<long>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
              (this,(string *)dVar1,(string *)local_90,expected_first,
               (_List_iterator<long>)got_first_local._M_current,got_last_local,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)this_local,
               (_List_iterator<long>)got_first_local._M_current,local_48,local_60);
  }
  local_f8 = got_first_local._M_current;
  local_100 = got_last_local._M_current;
  local_f0 = expected_first._M_node;
  local_e8 = std::
             mismatch<std::_List_iterator<long>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                       (expected_first,(_List_iterator<long>)got_first_local._M_current,
                        got_last_local);
  local_d8._M_node = local_e8.first._M_node;
  bVar2 = std::operator!=(&local_d8,(_Self *)&got_first_local);
  dVar1 = expected_len;
  if (!bVar2) {
    return;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_120,"",&local_121);
  RangeError<std::_List_iterator<long>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            (this,(string *)dVar1,(string *)local_120,expected_first,
             (_List_iterator<long>)got_first_local._M_current,got_last_local,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)this_local,
             (_List_iterator<long>)local_d8._M_node,local_48,local_60);
}

Assistant:

void RangeEquals(const std::string& msg, ExpectedIt expected_first, ExpectedIt expected_last,
            GotIterator got_first, GotIterator got_last) const
        {
            auto expected_len = std::distance(expected_first, expected_last);
            auto got_len      = std::distance(got_first, got_last);
            if (expected_len != got_len)
            {
                RangeError(msg, " length", expected_first, expected_last, got_first, got_last, expected_last,
                    expected_len, got_len);
            }

            auto dif = std::mismatch(expected_first, expected_last, got_first).first;
            if (dif != expected_last)
            {
                RangeError(msg, "", expected_first, expected_last, got_first, got_last, dif, expected_len, got_len);
            }
        }